

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void FFTProcess<float>(UnityComplexNumber *data,int numsamples,bool forward)

{
  UnityComplexNumber UVar1;
  uint uVar2;
  uint *puVar3;
  uint count;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint j;
  uint m;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  float __x;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  UnityComplexNumber UVar17;
  float fVar20;
  
  uVar10 = (ulong)(uint)numsamples;
  uVar2 = 0;
  for (uVar4 = 1; uVar4 < (uint)numsamples; uVar4 = uVar4 * 2) {
    uVar2 = uVar2 + 1;
  }
  puVar3 = FFTProcess<float>::reversetable[uVar2];
  if (puVar3 == (uint *)0x0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < numsamples) {
      uVar5 = uVar10 * 4;
    }
    puVar3 = (uint *)operator_new__(uVar5);
    for (uVar5 = 0; uVar5 != uVar10; uVar5 = uVar5 + 1) {
      uVar6 = 0;
      uVar4 = 1;
      for (uVar8 = numsamples >> 1; uVar8 != 0; uVar8 = uVar8 >> 1) {
        uVar9 = uVar8 & (uint)uVar5;
        if (uVar9 != 0) {
          uVar9 = uVar4;
        }
        uVar6 = uVar6 | uVar9;
        uVar4 = uVar4 * 2;
      }
      puVar3[uVar5] = uVar6;
    }
    FFTProcess<float>::reversetable[uVar2] = puVar3;
  }
  for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    uVar7 = (ulong)puVar3[uVar5];
    if (uVar5 < uVar7) {
      UVar1 = data[uVar5];
      data[uVar5] = data[uVar7];
      data[uVar7] = UVar1;
    }
  }
  if (forward) {
    __x = -3.1415927;
  }
  else {
    __x = 3.1415927;
  }
  uVar4 = 1;
  while ((int)uVar4 < numsamples) {
    fVar11 = cosf(__x);
    fVar12 = sinf(__x);
    uVar10 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar10 = 0;
    }
    fVar13 = 0.0;
    fVar14 = 1.0;
    for (uVar5 = 0; uVar5 != uVar10; uVar5 = uVar5 + 1) {
      fVar15 = -fVar13;
      for (uVar7 = uVar5; (long)uVar7 < (long)numsamples; uVar7 = uVar7 + (long)(int)(uVar4 * 2)) {
        fVar19 = data[(long)(int)uVar4 + uVar7].re;
        fVar18 = data[(long)(int)uVar4 + uVar7].im;
        fVar16 = fVar19 * fVar14 + fVar18 * fVar15;
        fVar19 = fVar18 * fVar14 + fVar19 * fVar13;
        fVar18 = data[uVar7].re;
        fVar20 = data[uVar7].im;
        UVar1.im = fVar20 - fVar19;
        UVar1.re = fVar18 - fVar16;
        data[(long)(int)uVar4 + uVar7] = UVar1;
        UVar17.re = fVar16 + fVar18;
        UVar17.im = fVar19 + fVar20;
        data[uVar7] = UVar17;
      }
      fVar13 = fVar14 * fVar12 + fVar13 * fVar11;
      fVar14 = fVar14 * fVar11 + fVar15 * fVar12;
    }
    __x = __x * 0.5;
    uVar4 = uVar4 * 2;
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}